

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O0

void __thiscall libcellml::ImportedEntity::ImportedEntity(ImportedEntity *this)

{
  ImportedEntityImpl *this_00;
  ImportedEntity *this_local;
  
  this->_vptr_ImportedEntity = (_func_int **)&PTR___cxa_pure_virtual_00469dd0;
  this_00 = (ImportedEntityImpl *)operator_new(0x30);
  memset(this_00,0,0x30);
  ImportedEntityImpl::ImportedEntityImpl(this_00);
  this->mPimpl = this_00;
  return;
}

Assistant:

ImportedEntity::ImportedEntity()
    : mPimpl(new ImportedEntityImpl())
{
}